

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O3

SinkCombineResultType __thiscall
duckdb::PhysicalCopyToFile::Combine
          (PhysicalCopyToFile *this,ExecutionContext *context,OperatorSinkCombineInput *input)

{
  CopyToFunctionLocalState *this_00;
  CopyToFunctionGlobalState *g;
  copy_to_combine_t p_Var1;
  copy_to_finalize_t p_Var2;
  ClientContext *pCVar3;
  GlobalSinkState *global_state;
  type pFVar4;
  type pGVar5;
  type pLVar6;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  this_00 = (CopyToFunctionLocalState *)input->local_state;
  if (this_00->total_rows_copied != 0) {
    g = (CopyToFunctionGlobalState *)input->global_state;
    LOCK();
    (g->rows_copied).super___atomic_base<unsigned_long>._M_i =
         (g->rows_copied).super___atomic_base<unsigned_long>._M_i + this_00->total_rows_copied;
    UNLOCK();
    if (this->partition_output == true) {
      CopyToFunctionLocalState::FlushPartitions(this_00,context,this,g);
    }
    else {
      p_Var1 = (this->function).copy_to_combine;
      if (p_Var1 != (copy_to_combine_t)0x0) {
        if (this->per_thread_output == true) {
          if ((this_00->global_state).
              super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
              .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl !=
              (GlobalFunctionData *)0x0) {
            pFVar4 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                     ::operator*(&this->bind_data);
            pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                     ::operator*(&this_00->global_state);
            pLVar6 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                     ::operator*(&this_00->local_state);
            (*p_Var1)(context,pFVar4,pGVar5,pLVar6);
            p_Var2 = (this->function).copy_to_finalize;
            pCVar3 = context->client;
            pFVar4 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                     ::operator*(&this->bind_data);
            pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                     ::operator*(&this_00->global_state);
            (*p_Var2)(pCVar3,pFVar4,pGVar5);
          }
        }
        else if (this->rotate == true) {
          global_state = input->global_state;
          local_50._8_8_ = 0;
          local_50._M_unused._M_object = operator_new(0x18);
          *(PhysicalCopyToFile **)local_50._M_unused._0_8_ = this;
          *(ExecutionContext **)((long)local_50._M_unused._0_8_ + 8) = context;
          *(CopyToFunctionLocalState **)((long)local_50._M_unused._0_8_ + 0x10) = this_00;
          local_38 = ::std::
                     _Function_handler<void_(duckdb::GlobalFunctionData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/execution/operator/persistent/physical_copy_to_file.cpp:578:53)>
                     ::_M_invoke;
          local_40 = ::std::
                     _Function_handler<void_(duckdb::GlobalFunctionData_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/execution/operator/persistent/physical_copy_to_file.cpp:578:53)>
                     ::_M_manager;
          WriteRotateInternal(this,context,global_state,
                              (function<void_(duckdb::GlobalFunctionData_&)> *)&local_50);
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
        }
        else if ((g->global_state).
                 super_unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
                 ._M_t.
                 super___uniq_ptr_impl<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_duckdb::GlobalFunctionData_*,_std::default_delete<duckdb::GlobalFunctionData>_>
                 .super__Head_base<0UL,_duckdb::GlobalFunctionData_*,_false>._M_head_impl !=
                 (GlobalFunctionData *)0x0) {
          pFVar4 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                   ::operator*(&this->bind_data);
          pGVar5 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                   ::operator*(&g->global_state);
          pLVar6 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                   ::operator*(&this_00->local_state);
          (*p_Var1)(context,pFVar4,pGVar5,pLVar6);
        }
      }
    }
  }
  return FINISHED;
}

Assistant:

SinkCombineResultType PhysicalCopyToFile::Combine(ExecutionContext &context, OperatorSinkCombineInput &input) const {
	auto &g = input.global_state.Cast<CopyToFunctionGlobalState>();
	auto &l = input.local_state.Cast<CopyToFunctionLocalState>();
	if (l.total_rows_copied == 0) {
		// no rows copied
		return SinkCombineResultType::FINISHED;
	}
	g.rows_copied += l.total_rows_copied;

	if (partition_output) {
		// flush all remaining partitions
		l.FlushPartitions(context, *this, g);
	} else if (function.copy_to_combine) {
		if (per_thread_output) {
			// For PER_THREAD_OUTPUT, we can combine/finalize immediately (if there is a gstate)
			if (l.global_state) {
				function.copy_to_combine(context, *bind_data, *l.global_state, *l.local_state);
				function.copy_to_finalize(context.client, *bind_data, *l.global_state);
			}
		} else if (rotate) {
			WriteRotateInternal(context, input.global_state, [&](GlobalFunctionData &gstate) {
				function.copy_to_combine(context, *bind_data, gstate, *l.local_state);
			});
		} else if (g.global_state) {
			function.copy_to_combine(context, *bind_data, *g.global_state, *l.local_state);
		}
	}

	return SinkCombineResultType::FINISHED;
}